

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

bool __thiscall slang::parsing::Parser::isSequenceRepetition(Parser *this)

{
  uint uVar1;
  bool bVar2;
  Token TVar3;
  
  TVar3 = ParserBase::peek(&this->super_ParserBase,1);
  bVar2 = true;
  if (((TVar3.kind != Star) && (uVar1 = TVar3._0_4_ & 0xffff, uVar1 != 0x35)) && (uVar1 != 0x27)) {
    if (uVar1 == 0x21) {
      TVar3 = ParserBase::peek(&this->super_ParserBase,2);
      bVar2 = TVar3.kind == CloseBracket;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Parser::isSequenceRepetition() {
    switch (peek(1).kind) {
        case TokenKind::Star:
        case TokenKind::Equals:
        case TokenKind::MinusArrow:
            return true;
        case TokenKind::Plus:
            return peek(2).kind == TokenKind::CloseBracket;
        default:
            return false;
    }
}